

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O3

void musig_nonce_bitflip(uchar **args,size_t n_flip,size_t n_bytes)

{
  uint uVar1;
  int iVar2;
  secp256k1_musig_keyagg_cache *keyagg_cache;
  uchar *seckey32;
  secp256k1_pubkey *pubkey;
  secp256k1_musig_session *secnonce;
  uchar *session_secrand;
  secp256k1_musig_session *session;
  secp256k1_musig_session *partial_sig;
  secp256k1_xonly_pubkey *pubkey_00;
  secp256k1_context *secnonce_00;
  secp256k1_context *keypair;
  secp256k1_scalar k2 [2];
  secp256k1_scalar k1 [2];
  secp256k1_scalar sStackY_748;
  secp256k1_scalar sStackY_728;
  secp256k1_ge sStackY_700;
  secp256k1_musig_session *psStackY_6a8;
  secp256k1_musig_keyagg_cache *psStackY_6a0;
  secp256k1_context *psStackY_698;
  secp256k1_musig_partial_sig *psStack_670;
  undefined1 *puStack_668;
  secp256k1_musig_pubnonce *psStack_660;
  secp256k1_musig_pubnonce *psStack_658;
  uchar auStack_650 [32];
  secp256k1_pubkey sStack_630;
  secp256k1_pubkey sStack_5f0;
  undefined1 auStack_5b0 [80];
  uchar auStack_560 [32];
  uchar auStack_540 [43];
  secp256k1_musig_session sStack_515;
  undefined1 auStack_490 [64];
  undefined1 auStack_450 [192];
  secp256k1_musig_pubnonce sStack_390;
  secp256k1_musig_pubnonce sStack_30c;
  undefined1 auStack_280 [276];
  undefined1 auStack_16c [140];
  uchar **ppuStack_e0;
  secp256k1_xonly_pubkey local_a8;
  secp256k1_scalar local_68;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  
  secp256k1_nonce_function_musig(&local_68,*args,args[1],args[2],args[3],args[4],args[5]);
  testrand_flip(args[n_flip],n_bytes);
  session_secrand = *args;
  keyagg_cache = (secp256k1_musig_keyagg_cache *)args[2];
  pubkey_00 = &local_a8;
  secp256k1_nonce_function_musig
            ((secp256k1_scalar *)pubkey_00,session_secrand,args[1],(uchar *)keyagg_cache,args[3],
             args[4],args[5]);
  if ((((local_68.d[0] == local_a8.data._0_8_) && (local_68.d[1] == local_a8.data._8_8_)) &&
      (local_68.d[2] == local_a8.data._16_8_)) && (local_68.d[3] == local_a8.data._24_8_)) {
    musig_nonce_bitflip_cold_1();
  }
  else if (((local_48 != local_a8.data._32_8_) || (local_40 != local_a8.data._40_8_)) ||
          ((local_38 != local_a8.data._48_8_ || (local_30 != local_a8.data._56_8_)))) {
    return;
  }
  musig_nonce_bitflip_cold_2();
  psStack_660 = &sStack_390;
  psStack_670 = (secp256k1_musig_partial_sig *)auStack_5b0;
  psStackY_698 = (secp256k1_context *)0x178f6b;
  auStack_16c._132_8_ = &local_68;
  ppuStack_e0 = args;
  testrand256(auStack_560);
  psStack_658 = &sStack_30c;
  puStack_668 = auStack_5b0 + 0x24;
  psStackY_698 = (secp256k1_context *)0x178f92;
  testrand256(auStack_540);
  session = (secp256k1_musig_session *)auStack_280;
  psStackY_698 = (secp256k1_context *)0x178fac;
  uVar1 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)session,session_secrand);
  keypair = (secp256k1_context *)(ulong)uVar1;
  sStack_630.data[0] = auStack_280[0x20];
  sStack_630.data[1] = auStack_280[0x21];
  sStack_630.data[2] = auStack_280[0x22];
  sStack_630.data[3] = auStack_280[0x23];
  sStack_630.data[4] = auStack_280[0x24];
  sStack_630.data[5] = auStack_280[0x25];
  sStack_630.data[6] = auStack_280[0x26];
  sStack_630.data[7] = auStack_280[0x27];
  sStack_630.data[8] = auStack_280[0x28];
  sStack_630.data[9] = auStack_280[0x29];
  sStack_630.data[10] = auStack_280[0x2a];
  sStack_630.data[0xb] = auStack_280[0x2b];
  sStack_630.data[0xc] = auStack_280[0x2c];
  sStack_630.data[0xd] = auStack_280[0x2d];
  sStack_630.data[0xe] = auStack_280[0x2e];
  sStack_630.data[0xf] = auStack_280[0x2f];
  sStack_630.data[0x10] = auStack_280[0x30];
  sStack_630.data[0x11] = auStack_280[0x31];
  sStack_630.data[0x12] = auStack_280[0x32];
  sStack_630.data[0x13] = auStack_280[0x33];
  sStack_630.data[0x14] = auStack_280[0x34];
  sStack_630.data[0x15] = auStack_280[0x35];
  sStack_630.data[0x16] = auStack_280[0x36];
  sStack_630.data[0x17] = auStack_280[0x37];
  sStack_630.data[0x18] = auStack_280[0x38];
  sStack_630.data[0x19] = auStack_280[0x39];
  sStack_630.data[0x1a] = auStack_280[0x3a];
  sStack_630.data[0x1b] = auStack_280[0x3b];
  sStack_630.data[0x1c] = auStack_280[0x3c];
  sStack_630.data[0x1d] = auStack_280[0x3d];
  sStack_630.data[0x1e] = auStack_280[0x3e];
  sStack_630.data[0x1f] = auStack_280[0x3f];
  sStack_630.data[0x20] = auStack_280[0x40];
  sStack_630.data[0x21] = auStack_280[0x41];
  sStack_630.data[0x22] = auStack_280[0x42];
  sStack_630.data[0x23] = auStack_280[0x43];
  sStack_630.data[0x24] = auStack_280[0x44];
  sStack_630.data[0x25] = auStack_280[0x45];
  sStack_630.data[0x26] = auStack_280[0x46];
  sStack_630.data[0x27] = auStack_280[0x47];
  sStack_630.data[0x28] = auStack_280[0x48];
  sStack_630.data[0x29] = auStack_280[0x49];
  sStack_630.data[0x2a] = auStack_280[0x4a];
  sStack_630.data[0x2b] = auStack_280[0x4b];
  sStack_630.data[0x2c] = auStack_280[0x4c];
  sStack_630.data[0x2d] = auStack_280[0x4d];
  sStack_630.data[0x2e] = auStack_280[0x4e];
  sStack_630.data[0x2f] = auStack_280[0x4f];
  sStack_630.data[0x30] = auStack_280[0x50];
  sStack_630.data[0x31] = auStack_280[0x51];
  sStack_630.data[0x32] = auStack_280[0x52];
  sStack_630.data[0x33] = auStack_280[0x53];
  sStack_630.data[0x34] = auStack_280[0x54];
  sStack_630.data[0x35] = auStack_280[0x55];
  sStack_630.data[0x36] = auStack_280[0x56];
  sStack_630.data[0x37] = auStack_280[0x57];
  sStack_630.data[0x38] = auStack_280[0x58];
  sStack_630.data[0x39] = auStack_280[0x59];
  sStack_630.data[0x3a] = auStack_280[0x5a];
  sStack_630.data[0x3b] = auStack_280[0x5b];
  sStack_630.data[0x3c] = auStack_280[0x5c];
  sStack_630.data[0x3d] = auStack_280[0x5d];
  sStack_630.data[0x3e] = auStack_280[0x5e];
  sStack_630.data[0x3f] = auStack_280[0x5f];
  secnonce_00 = (secp256k1_context *)auStack_450;
  psStackY_698 = (secp256k1_context *)0x178fee;
  memcpy(secnonce_00,session,0x60);
  if (uVar1 == 0) {
    psStackY_698 = (secp256k1_context *)0x17928c;
    musig_tweak_test_helper_cold_12();
LAB_0017928c:
    psStackY_698 = (secp256k1_context *)0x179291;
    musig_tweak_test_helper_cold_11();
LAB_00179291:
    secnonce = (secp256k1_musig_session *)auStack_280;
    psStackY_698 = (secp256k1_context *)0x179296;
    musig_tweak_test_helper_cold_1();
LAB_00179296:
    psStackY_698 = (secp256k1_context *)0x17929b;
    musig_tweak_test_helper_cold_2();
LAB_0017929b:
    psStackY_698 = (secp256k1_context *)0x1792a0;
    musig_tweak_test_helper_cold_10();
LAB_001792a0:
    psStackY_698 = (secp256k1_context *)0x1792a5;
    musig_tweak_test_helper_cold_9();
LAB_001792a5:
    psStackY_698 = (secp256k1_context *)0x1792aa;
    musig_tweak_test_helper_cold_8();
LAB_001792aa:
    psStackY_698 = (secp256k1_context *)0x1792af;
    musig_tweak_test_helper_cold_7();
LAB_001792af:
    partial_sig = session;
    psStackY_698 = (secp256k1_context *)0x1792b4;
    musig_tweak_test_helper_cold_3();
LAB_001792b4:
    psStackY_698 = (secp256k1_context *)0x1792b9;
    musig_tweak_test_helper_cold_4();
  }
  else {
    keypair = (secp256k1_context *)(auStack_450 + 0x60);
    session = (secp256k1_musig_session *)auStack_280;
    psStackY_698 = (secp256k1_context *)0x17901e;
    iVar2 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)session,seckey32);
    sStack_5f0.data[0] = auStack_280[0x20];
    sStack_5f0.data[1] = auStack_280[0x21];
    sStack_5f0.data[2] = auStack_280[0x22];
    sStack_5f0.data[3] = auStack_280[0x23];
    sStack_5f0.data[4] = auStack_280[0x24];
    sStack_5f0.data[5] = auStack_280[0x25];
    sStack_5f0.data[6] = auStack_280[0x26];
    sStack_5f0.data[7] = auStack_280[0x27];
    sStack_5f0.data[8] = auStack_280[0x28];
    sStack_5f0.data[9] = auStack_280[0x29];
    sStack_5f0.data[10] = auStack_280[0x2a];
    sStack_5f0.data[0xb] = auStack_280[0x2b];
    sStack_5f0.data[0xc] = auStack_280[0x2c];
    sStack_5f0.data[0xd] = auStack_280[0x2d];
    sStack_5f0.data[0xe] = auStack_280[0x2e];
    sStack_5f0.data[0xf] = auStack_280[0x2f];
    sStack_5f0.data[0x10] = auStack_280[0x30];
    sStack_5f0.data[0x11] = auStack_280[0x31];
    sStack_5f0.data[0x12] = auStack_280[0x32];
    sStack_5f0.data[0x13] = auStack_280[0x33];
    sStack_5f0.data[0x14] = auStack_280[0x34];
    sStack_5f0.data[0x15] = auStack_280[0x35];
    sStack_5f0.data[0x16] = auStack_280[0x36];
    sStack_5f0.data[0x17] = auStack_280[0x37];
    sStack_5f0.data[0x18] = auStack_280[0x38];
    sStack_5f0.data[0x19] = auStack_280[0x39];
    sStack_5f0.data[0x1a] = auStack_280[0x3a];
    sStack_5f0.data[0x1b] = auStack_280[0x3b];
    sStack_5f0.data[0x1c] = auStack_280[0x3c];
    sStack_5f0.data[0x1d] = auStack_280[0x3d];
    sStack_5f0.data[0x1e] = auStack_280[0x3e];
    sStack_5f0.data[0x1f] = auStack_280[0x3f];
    sStack_5f0.data[0x20] = auStack_280[0x40];
    sStack_5f0.data[0x21] = auStack_280[0x41];
    sStack_5f0.data[0x22] = auStack_280[0x42];
    sStack_5f0.data[0x23] = auStack_280[0x43];
    sStack_5f0.data[0x24] = auStack_280[0x44];
    sStack_5f0.data[0x25] = auStack_280[0x45];
    sStack_5f0.data[0x26] = auStack_280[0x46];
    sStack_5f0.data[0x27] = auStack_280[0x47];
    sStack_5f0.data[0x28] = auStack_280[0x48];
    sStack_5f0.data[0x29] = auStack_280[0x49];
    sStack_5f0.data[0x2a] = auStack_280[0x4a];
    sStack_5f0.data[0x2b] = auStack_280[0x4b];
    sStack_5f0.data[0x2c] = auStack_280[0x4c];
    sStack_5f0.data[0x2d] = auStack_280[0x4d];
    sStack_5f0.data[0x2e] = auStack_280[0x4e];
    sStack_5f0.data[0x2f] = auStack_280[0x4f];
    sStack_5f0.data[0x30] = auStack_280[0x50];
    sStack_5f0.data[0x31] = auStack_280[0x51];
    sStack_5f0.data[0x32] = auStack_280[0x52];
    sStack_5f0.data[0x33] = auStack_280[0x53];
    sStack_5f0.data[0x34] = auStack_280[0x54];
    sStack_5f0.data[0x35] = auStack_280[0x55];
    sStack_5f0.data[0x36] = auStack_280[0x56];
    sStack_5f0.data[0x37] = auStack_280[0x57];
    sStack_5f0.data[0x38] = auStack_280[0x58];
    sStack_5f0.data[0x39] = auStack_280[0x59];
    sStack_5f0.data[0x3a] = auStack_280[0x5a];
    sStack_5f0.data[0x3b] = auStack_280[0x5b];
    sStack_5f0.data[0x3c] = auStack_280[0x5c];
    sStack_5f0.data[0x3d] = auStack_280[0x5d];
    sStack_5f0.data[0x3e] = auStack_280[0x5e];
    sStack_5f0.data[0x3f] = auStack_280[0x5f];
    psStackY_698 = (secp256k1_context *)0x179061;
    secnonce_00 = keypair;
    memcpy(keypair,session,0x60);
    if (iVar2 == 0) goto LAB_0017928c;
    psStackY_698 = (secp256k1_context *)0x179074;
    testrand256(auStack_650);
    session = (secp256k1_musig_session *)auStack_280;
    psStackY_698 = (secp256k1_context *)0x1790b6;
    secnonce_00 = CTX;
    iVar2 = secp256k1_musig_nonce_gen
                      (CTX,(secp256k1_musig_secnonce *)session,&sStack_390,auStack_560,
                       session_secrand,&sStack_630,(uchar *)0x0,(secp256k1_musig_keyagg_cache *)0x0,
                       (uchar *)0x0);
    if (iVar2 != 1) goto LAB_00179291;
    secnonce = (secp256k1_musig_session *)(auStack_280 + 0x84);
    psStackY_698 = (secp256k1_context *)0x179102;
    session = secnonce;
    secnonce_00 = CTX;
    iVar2 = secp256k1_musig_nonce_gen
                      (CTX,(secp256k1_musig_secnonce *)secnonce,&sStack_30c,auStack_540,seckey32,
                       &sStack_5f0,(uchar *)0x0,(secp256k1_musig_keyagg_cache *)0x0,(uchar *)0x0);
    if (iVar2 != 1) goto LAB_00179296;
    session = (secp256k1_musig_session *)auStack_16c;
    psStackY_698 = (secp256k1_context *)0x179129;
    secnonce_00 = CTX;
    iVar2 = secp256k1_musig_nonce_agg(CTX,(secp256k1_musig_aggnonce *)session,&psStack_660,2);
    if (iVar2 == 0) goto LAB_0017929b;
    session = &sStack_515;
    psStackY_698 = (secp256k1_context *)0x179155;
    secnonce_00 = CTX;
    iVar2 = secp256k1_musig_nonce_process
                      (CTX,session,(secp256k1_musig_aggnonce *)auStack_16c,auStack_650,keyagg_cache)
    ;
    if (iVar2 == 0) goto LAB_001792a0;
    session = (secp256k1_musig_session *)auStack_5b0;
    psStackY_698 = (secp256k1_context *)0x17918c;
    secnonce_00 = CTX;
    iVar2 = secp256k1_musig_partial_sign
                      (CTX,(secp256k1_musig_partial_sig *)session,
                       (secp256k1_musig_secnonce *)auStack_280,(secp256k1_keypair *)auStack_450,
                       keyagg_cache,&sStack_515);
    if (iVar2 == 0) goto LAB_001792a5;
    partial_sig = (secp256k1_musig_session *)(auStack_5b0 + 0x24);
    psStackY_698 = (secp256k1_context *)0x1791bc;
    session = partial_sig;
    secnonce_00 = CTX;
    iVar2 = secp256k1_musig_partial_sign
                      (CTX,(secp256k1_musig_partial_sig *)partial_sig,
                       (secp256k1_musig_secnonce *)secnonce,(secp256k1_keypair *)keypair,
                       keyagg_cache,&sStack_515);
    if (iVar2 == 0) goto LAB_001792aa;
    session = (secp256k1_musig_session *)auStack_5b0;
    psStackY_698 = (secp256k1_context *)0x1791f0;
    secnonce_00 = CTX;
    iVar2 = secp256k1_musig_partial_sig_verify
                      (CTX,(secp256k1_musig_partial_sig *)session,&sStack_390,&sStack_630,
                       keyagg_cache,&sStack_515);
    if (iVar2 != 1) goto LAB_001792af;
    psStackY_698 = (secp256k1_context *)0x179219;
    secnonce_00 = CTX;
    iVar2 = secp256k1_musig_partial_sig_verify
                      (CTX,(secp256k1_musig_partial_sig *)partial_sig,&sStack_30c,&sStack_5f0,
                       keyagg_cache,&sStack_515);
    if (iVar2 != 1) goto LAB_001792b4;
    partial_sig = (secp256k1_musig_session *)auStack_490;
    psStackY_698 = (secp256k1_context *)0x179249;
    secnonce_00 = CTX;
    iVar2 = secp256k1_musig_partial_sig_agg(CTX,(uchar *)partial_sig,&sStack_515,&psStack_670,2);
    if (iVar2 == 1) {
      partial_sig = (secp256k1_musig_session *)auStack_490;
      psStackY_698 = (secp256k1_context *)0x179271;
      secnonce_00 = CTX;
      iVar2 = secp256k1_schnorrsig_verify(CTX,(uchar *)partial_sig,auStack_650,0x20,pubkey_00);
      if (iVar2 != 0) {
        return;
      }
      goto LAB_001792be;
    }
  }
  psStackY_698 = (secp256k1_context *)0x1792be;
  musig_tweak_test_helper_cold_5();
LAB_001792be:
  psStackY_698 = (secp256k1_context *)musig_test_set_secnonce;
  musig_tweak_test_helper_cold_6();
  psStackY_6a8 = secnonce;
  psStackY_6a0 = keyagg_cache;
  psStackY_698 = keypair;
  secp256k1_scalar_set_b32(&sStackY_748,partial_sig->data,(int *)0x0);
  secp256k1_scalar_set_b32(&sStackY_728,partial_sig->data + 0x20,(int *)0x0);
  iVar2 = secp256k1_pubkey_load(CTX,&sStackY_700,pubkey);
  if (iVar2 != 0) {
    secp256k1_musig_secnonce_save((secp256k1_musig_secnonce *)secnonce_00,&sStackY_748,&sStackY_700)
    ;
    return;
  }
  musig_test_set_secnonce_cold_1();
  return;
}

Assistant:

static void musig_nonce_bitflip(unsigned char **args, size_t n_flip, size_t n_bytes) {
    secp256k1_scalar k1[2], k2[2];

    secp256k1_nonce_function_musig(k1, args[0], args[1], args[2], args[3], args[4], args[5]);
    testrand_flip(args[n_flip], n_bytes);
    secp256k1_nonce_function_musig(k2, args[0], args[1], args[2], args[3], args[4], args[5]);
    CHECK(secp256k1_scalar_eq(&k1[0], &k2[0]) == 0);
    CHECK(secp256k1_scalar_eq(&k1[1], &k2[1]) == 0);
}